

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O0

int lws_interface_to_sa(int ipv6,char *ifname,sockaddr_in *addr,size_t addrlen)

{
  sa_family_t sVar1;
  sockaddr *psVar2;
  int iVar3;
  ifaddrs *local_40;
  ifaddrs *ifc;
  ifaddrs *ifr;
  size_t sStack_28;
  int rc;
  size_t addrlen_local;
  sockaddr_in *addr_local;
  char *ifname_local;
  int ipv6_local;
  
  ifr._4_4_ = -1;
  sStack_28 = addrlen;
  addrlen_local = (size_t)addr;
  addr_local = (sockaddr_in *)ifname;
  ifname_local._4_4_ = ipv6;
  getifaddrs(&ifc);
  for (local_40 = ifc; local_40 != (ifaddrs *)0x0 && ifr._4_4_ != 0; local_40 = local_40->ifa_next)
  {
    if (local_40->ifa_addr != (sockaddr *)0x0) {
      _lws_log(0x10," interface %s vs %s (fam %d) ipv6 %d\n",local_40->ifa_name,addr_local,
               (ulong)local_40->ifa_addr->sa_family,(ulong)ifname_local._4_4_);
      iVar3 = strcmp(local_40->ifa_name,(char *)addr_local);
      if (iVar3 == 0) {
        sVar1 = local_40->ifa_addr->sa_family;
        if (sVar1 == 2) {
          psVar2 = local_40->ifa_addr;
          *(undefined8 *)addrlen_local = *(undefined8 *)psVar2;
          *(undefined8 *)(addrlen_local + 8) = *(undefined8 *)(psVar2->sa_data + 6);
          ifr._4_4_ = 0;
        }
        else if (sVar1 == 0x11) {
          ifr._4_4_ = -2;
        }
      }
    }
  }
  freeifaddrs(ifc);
  if ((ifr._4_4_ != 0) &&
     (iVar3 = inet_pton(2,(char *)addr_local,(void *)(addrlen_local + 4)), iVar3 == 1)) {
    ifr._4_4_ = 0;
  }
  return ifr._4_4_;
}

Assistant:

int
lws_interface_to_sa(int ipv6, const char *ifname, struct sockaddr_in *addr,
		    size_t addrlen)
{
	int rc = LWS_ITOSA_NOT_EXIST;

	struct ifaddrs *ifr;
	struct ifaddrs *ifc;
#ifdef LWS_WITH_IPV6
	struct sockaddr_in6 *addr6 = (struct sockaddr_in6 *)addr;
#endif

	getifaddrs(&ifr);
	for (ifc = ifr; ifc != NULL && rc; ifc = ifc->ifa_next) {
		if (!ifc->ifa_addr)
			continue;

		lwsl_debug(" interface %s vs %s (fam %d) ipv6 %d\n",
			   ifc->ifa_name, ifname,
			   ifc->ifa_addr->sa_family, ipv6);

		if (strcmp(ifc->ifa_name, ifname))
			continue;

		switch (ifc->ifa_addr->sa_family) {
#if defined(AF_PACKET)
		case AF_PACKET:
			/* interface exists but is not usable */
			rc = LWS_ITOSA_NOT_USABLE;
			continue;
#endif

		case AF_INET:
#ifdef LWS_WITH_IPV6
			if (ipv6) {
				/* map IPv4 to IPv6 */
				memset((char *)&addr6->sin6_addr, 0,
						sizeof(struct in6_addr));
				addr6->sin6_addr.s6_addr[10] = 0xff;
				addr6->sin6_addr.s6_addr[11] = 0xff;
				memcpy(&addr6->sin6_addr.s6_addr[12],
				       &((struct sockaddr_in *)ifc->ifa_addr)->sin_addr,
							sizeof(struct in_addr));
				lwsl_debug("%s: uplevelling ipv4 bind to ipv6\n", __func__);
			} else
#endif
				memcpy(addr,
					(struct sockaddr_in *)ifc->ifa_addr,
						    sizeof(struct sockaddr_in));
			break;
#ifdef LWS_WITH_IPV6
		case AF_INET6:
			memcpy(&addr6->sin6_addr,
			  &((struct sockaddr_in6 *)ifc->ifa_addr)->sin6_addr,
						       sizeof(struct in6_addr));
			break;
#endif
		default:
			continue;
		}
		rc = LWS_ITOSA_USABLE;
	}

	freeifaddrs(ifr);

	if (rc) {
		/* check if bind to IP address */
#ifdef LWS_WITH_IPV6
		if (inet_pton(AF_INET6, ifname, &addr6->sin6_addr) == 1)
			rc = LWS_ITOSA_USABLE;
		else
#endif
		if (inet_pton(AF_INET, ifname, &addr->sin_addr) == 1)
			rc = LWS_ITOSA_USABLE;
	}

	return rc;
}